

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::printStats(Solver *this)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long in_RDI;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  double mem_used;
  double cpu_time;
  Solver *this_00;
  float local_5c;
  float local_1c;
  
  dVar8 = cpuTime();
  dVar9 = memUsedPeak();
  printf("c restarts              : %lu\n",*(undefined8 *)(in_RDI + 0xd0));
  uVar1 = *(undefined8 *)(in_RDI + 0xf0);
  auVar10._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar10._0_8_ = uVar1;
  auVar10._12_4_ = 0x45300000;
  printf("c conflicts             : %-12lu   (%.0f /sec)\n",
         ((auVar10._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar8);
  uVar2 = *(ulong *)(in_RDI + 0xd8);
  local_1c = (float)*(ulong *)(in_RDI + 0xe0);
  local_5c = (float)uVar2;
  auVar15._8_4_ = (int)(uVar2 >> 0x20);
  auVar15._0_8_ = uVar2;
  auVar15._12_4_ = 0x45300000;
  printf("c decisions             : %-12lu   (%4.2f %% random) (%.0f /sec)\n",
         (double)((local_1c * 100.0) / local_5c),
         ((auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / dVar8);
  uVar1 = *(undefined8 *)(in_RDI + 0xe8);
  auVar11._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar11._0_8_ = uVar1;
  auVar11._12_4_ = 0x45300000;
  printf("c propagations          : %-12lu   (%.0f /sec)\n",
         ((auVar11._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar8);
  lVar7 = *(long *)(in_RDI + 0x118);
  lVar6 = (lVar7 - *(long *)(in_RDI + 0x120)) * 100;
  auVar12._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar12._0_8_ = lVar6;
  auVar12._12_4_ = 0x45300000;
  auVar16._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar16._0_8_ = lVar7;
  auVar16._12_4_ = 0x45300000;
  printf("c conflict literals     : %-12lu   (%4.2f %% deleted)\n",
         ((auVar12._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
         ((auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)));
  lVar7 = *(long *)(in_RDI + 0x130) + *(long *)(in_RDI + 0x128);
  lVar6 = *(long *)(in_RDI + 0x130) * 100;
  auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar13._0_8_ = lVar6;
  auVar13._12_4_ = 0x45300000;
  auVar20._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar20._0_8_ = lVar7;
  auVar20._12_4_ = 0x45300000;
  dVar19 = (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
  lVar7 = *(long *)(in_RDI + 0x128) * 100;
  auVar17._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar17._0_8_ = lVar7;
  auVar17._12_4_ = 0x45300000;
  printf("c backtracks            : %-12lu   (NCB %0.f%% , CB %0.f%%)\n",
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / dVar19,
         ((auVar17._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / dVar19);
  uVar3 = *(undefined8 *)(in_RDI + 0x1a0);
  auVar14._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar14._0_8_ = uVar3;
  auVar14._12_4_ = 0x45300000;
  uVar1 = *(undefined8 *)(in_RDI + 0xe8);
  auVar18._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar18._0_8_ = uVar1;
  auVar18._12_4_ = 0x45300000;
  printf("c partial restarts      : %-12lu   (partial: %lu  savedD: %lu savedP: %lu (%.2lf %%))\n",
         (((auVar14._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * 100.0) /
         ((auVar18._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)),
         *(undefined8 *)(in_RDI + 0xd0),*(undefined8 *)(in_RDI + 0x1a8),
         *(undefined8 *)(in_RDI + 0x198));
  printf("c polarity              : %d pos, %d neg\n",(ulong)*(uint *)(in_RDI + 0x18c),
         (ulong)*(uint *)(in_RDI + 400));
  printf("c LCM                   : %lu runs, %lu Ctried, %lu Cshrinked (%lu known duplicates), %lu Ldeleted, %lu Lrev-deleted\n"
         ,*(undefined8 *)(in_RDI + 0x6a0),*(undefined8 *)(in_RDI + 0x748),
         *(undefined8 *)(in_RDI + 0x750),*(undefined8 *)(in_RDI + 0x6c0),
         *(undefined8 *)(in_RDI + 0x758),*(undefined8 *)(in_RDI + 0x760));
  printf("c Inprocessing          : %lu subsumed, %lu dropped lits, %lu attempts, %lu mems\n",
         *(undefined8 *)(in_RDI + 0x1d0),*(undefined8 *)(in_RDI + 0x1d8),
         *(undefined8 *)(in_RDI + 0x1e8),*(undefined8 *)(in_RDI + 0x1e0));
  uVar1 = *(undefined8 *)(in_RDI + 0x1f8);
  this_00 = *(Solver **)(in_RDI + 0x208);
  uVar3 = *(undefined8 *)(in_RDI + 0x200);
  uVar5 = nVars((Solver *)0x13f989);
  bVar4 = withinBudget(this_00);
  printf("c Stats:                : %lf solve, %lu steps, %lf simp, %lu steps, %d var, budget: %d\n"
         ,uVar1,this_00,uVar3,(ulong)uVar5,(ulong)bVar4);
  printf("c backup trail: stored: %lu used successfully: %lu\n",*(undefined8 *)(in_RDI + 0x138),
         *(undefined8 *)(in_RDI + 0x140));
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    printf("c Memory used           : %.2f MB\n",dVar9);
  }
  printf("c CPU time              : %g s\n",dVar8);
  return;
}

Assistant:

void Solver::printStats()
{
    double cpu_time = cpuTime();
    double mem_used = memUsedPeak();
    printf("c restarts              : %" PRIu64 "\n", starts);
    printf("c conflicts             : %-12" PRIu64 "   (%.0f /sec)\n", conflicts, conflicts / cpu_time);
    printf("c decisions             : %-12" PRIu64 "   (%4.2f %% random) (%.0f /sec)\n", decisions,
           (float)rnd_decisions * 100 / (float)decisions, decisions / cpu_time);
    printf("c propagations          : %-12" PRIu64 "   (%.0f /sec)\n", propagations, propagations / cpu_time);
    printf("c conflict literals     : %-12" PRIu64 "   (%4.2f %% deleted)\n", tot_literals,
           (max_literals - tot_literals) * 100 / (double)max_literals);
    printf("c backtracks            : %-12" PRIu64 "   (NCB %0.f%% , CB %0.f%%)\n", non_chrono_backtrack + chrono_backtrack,
           (non_chrono_backtrack * 100) / (double)(non_chrono_backtrack + chrono_backtrack),
           (chrono_backtrack * 100) / (double)(non_chrono_backtrack + chrono_backtrack));
    printf("c partial restarts      : %-12" PRIu64 "   (partial: %" PRIu64 "  savedD: %" PRIu64 " savedP: %" PRIu64
           " (%.2lf %%))\n",
           starts, restart.partialRestarts, restart.savedDecisions, restart.savedPropagations,
           ((double)restart.savedPropagations * 100.0) / (double)propagations);
    printf("c polarity              : %d pos, %d neg\n", posMissingInSome, negMissingInSome);
    printf("c LCM                   : %lu runs, %lu Ctried, %lu Cshrinked (%lu known duplicates), %lu Ldeleted, %lu "
           "Lrev-deleted\n",
           nbSimplifyAll, LCM_total_tries, LCM_successful_tries, nr_lcm_duplicates, LCM_dropped_lits, LCM_dropped_reverse);
    printf("c Inprocessing          : %lu subsumed, %lu dropped lits, %lu attempts, %lu mems\n", inprocessing_C,
           inprocessing_L, inprocessings, inprocess_mems);
    printf("c Stats:                : %lf solve, %lu steps, %lf simp, %lu steps, %d var, budget: %d\n", statistics.solveSeconds,
           statistics.solveSteps, statistics.simpSeconds, statistics.simpSteps, nVars(), withinBudget());
    printf("c backup trail: stored: %lu used successfully: %lu\n", backuped_trail_lits, used_backup_lits);
    if (mem_used != 0) printf("c Memory used           : %.2f MB\n", mem_used);
    printf("c CPU time              : %g s\n", cpu_time);
}